

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPoolTest.cpp
# Opt level: O1

int main(void)

{
  undefined1 local_120 [8];
  ThreadPool pool;
  _Any_data local_48;
  undefined1 local_38 [16];
  
  local_48._M_unused._M_object = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TestThread","");
  pool._176_8_ = Foo;
  higan::Thread::Thread((Thread *)local_120,(string *)&local_48,(ThreadFunc *)&pool.running_);
  std::_Function_handler<void_(),_void_(*)()>::_M_manager
            ((_Any_data *)&pool.running_,(_Any_data *)&pool.running_,__destroy_functor);
  if ((undefined1 *)local_48._M_unused._0_8_ != local_38) {
    operator_delete(local_48._M_unused._M_object,local_38._0_8_ + 1);
  }
  higan::Thread::Start((Thread *)local_120);
  higan::Thread::~Thread((Thread *)local_120);
  local_48._M_unused._M_object = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TestThreadPool","");
  higan::ThreadPool::ThreadPool((ThreadPool *)local_120,(string *)&local_48);
  if ((undefined1 *)local_48._M_unused._0_8_ != local_38) {
    operator_delete(local_48._M_unused._M_object,local_38._0_8_ + 1);
  }
  higan::ThreadPool::Init((ThreadPool *)local_120,2);
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = Foo;
  local_38._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_38._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  higan::ThreadPool::CallFunction((ThreadPool *)local_120,(ThreadFunc *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  sleep(1);
  higan::ThreadPool::~ThreadPool((ThreadPool *)local_120);
  return 0;
}

Assistant:

int main()
{

	{
		/**
		 * 测试detach 未被Join线程
		 */
		higan::Thread thread("TestThread", Foo);
		thread.Start();
	}


	higan::ThreadPool pool("TestThreadPool");
	pool.Init(2);

	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);

	sleep(1);

	return 0;
}